

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O3

void __thiscall QTableModel::removeItem(QTableModel *this,QTableWidgetItem *item)

{
  ulong uVar1;
  long *plVar2;
  long lVar3;
  pointer ppQVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long in_FS_OFFSET;
  undefined1 *local_48;
  undefined1 *puStack_40;
  QTableWidgetItem *local_38;
  Data *local_30;
  
  local_30 = *(Data **)(in_FS_OFFSET + 0x28);
  lVar10 = -0x100000000;
  lVar3 = (this->tableItems).d.size;
  if (lVar3 == 0) {
LAB_00591993:
    lVar3 = (this->verticalHeaderItems).d.size;
    if (lVar3 != 0) {
      iVar5 = 1;
      lVar9 = -0x100000000;
      lVar8 = 0;
      do {
        if (lVar3 << 3 == lVar8) goto LAB_005919d3;
        iVar5 = iVar5 + -1;
        lVar9 = lVar9 + 0x100000000;
        plVar2 = (long *)((long)(this->verticalHeaderItems).d.ptr + lVar8);
        lVar8 = lVar8 + 8;
      } while ((QTableWidgetItem *)*plVar2 != item);
      if (iVar5 != 1) {
        ppQVar4 = QList<QTableWidgetItem_*>::data(&this->verticalHeaderItems);
        *(undefined8 *)((long)ppQVar4 + (lVar9 >> 0x1d)) = 0;
        if (*(Data **)(in_FS_OFFSET + 0x28) == local_30) {
          iVar6 = 2;
          goto LAB_00591b0e;
        }
        goto LAB_00591b23;
      }
    }
LAB_005919d3:
    lVar3 = (this->horizontalHeaderItems).d.size;
    if (lVar3 != 0) {
      iVar5 = 1;
      lVar8 = 0;
      do {
        if (lVar3 << 3 == lVar8) goto LAB_00591ac6;
        iVar5 = iVar5 + -1;
        lVar10 = lVar10 + 0x100000000;
        plVar2 = (long *)((long)(this->horizontalHeaderItems).d.ptr + lVar8);
        lVar8 = lVar8 + 8;
      } while ((QTableWidgetItem *)*plVar2 != item);
      if (iVar5 != 1) {
        ppQVar4 = QList<QTableWidgetItem_*>::data(&this->horizontalHeaderItems);
        *(undefined8 *)((long)ppQVar4 + (lVar10 >> 0x1d)) = 0;
        if (*(Data **)(in_FS_OFFSET + 0x28) == local_30) {
          iVar6 = 1;
LAB_00591b0e:
          QAbstractItemModel::headerDataChanged((Orientation)this,iVar6,-iVar5);
          return;
        }
        goto LAB_00591b23;
      }
    }
  }
  else {
    lVar8 = -0x100000000;
    uVar7 = 0xfffffffffffffff8;
    do {
      if (lVar3 * -8 + uVar7 == -8) goto LAB_00591993;
      lVar8 = lVar8 + 0x100000000;
      uVar1 = uVar7 + 8;
      lVar9 = uVar7 + 8;
      uVar7 = uVar1;
    } while (*(QTableWidgetItem **)((long)(this->tableItems).d.ptr + lVar9) != item);
    if ((int)(~uVar1 >> 3) == 0) goto LAB_00591993;
    local_38 = (QTableWidgetItem *)&DAT_aaaaaaaaaaaaaaaa;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    index((QTableModel *)&local_48,(char *)this,(int)item);
    ppQVar4 = QList<QTableWidgetItem_*>::data(&this->tableItems);
    *(undefined8 *)((long)ppQVar4 + (lVar8 >> 0x1d)) = 0;
    QAbstractItemModel::dataChanged
              ((QModelIndex *)this,(QModelIndex *)&local_48,(QList_conflict *)&local_48);
  }
LAB_00591ac6:
  if (*(Data **)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
LAB_00591b23:
  __stack_chk_fail();
}

Assistant:

void QTableModel::removeItem(QTableWidgetItem *item)
{
    int i = tableItems.indexOf(item);
    if (i != -1) {
        QModelIndex idx = index(item);
        tableItems[i] = nullptr;
        emit dataChanged(idx, idx);
        return;
    }

    i = verticalHeaderItems.indexOf(item);

    if (i != -1) {
        verticalHeaderItems[i] = 0;
        emit headerDataChanged(Qt::Vertical, i, i);
        return;
    }
    i = horizontalHeaderItems.indexOf(item);
    if (i != -1) {
        horizontalHeaderItems[i] = 0;
        emit headerDataChanged(Qt::Horizontal, i, i);
        return;
    }
}